

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Lexer::ParseName(Lexer *this)

{
  Lexer *ptr;
  char cVar1;
  char cVar2;
  byte *ptr_00;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  Lexer *pLVar8;
  string_view name;
  string_view name_00;
  
  pLVar8 = (Lexer *)this->m_current;
  cVar1 = *(char *)&(pLVar8->m_name)._M_dataplus._M_p;
  if (cVar1 == '\'') {
    sVar7 = GetUtf8CharSize((char *)pLVar8);
    this->m_current = this->m_current + sVar7;
    this->m_columnNumber = this->m_columnNumber + 1;
  }
  ptr_00 = (byte *)this->m_current;
  if (((byte)(*ptr_00 - 0x2d) < 2 || *ptr_00 - 0x30 < 10) ||
     (bVar5 = IsName(pLVar8,(char *)ptr_00), !bVar5)) {
    Error<>(this,"Invalid character in name");
  }
  pLVar8 = (Lexer *)this->m_current;
  do {
    while( true ) {
      sVar7 = GetUtf8CharSize((char *)pLVar8);
      pcVar3 = this->m_current;
      ptr = (Lexer *)(pcVar3 + sVar7);
      this->m_current = (char *)ptr;
      this->m_columnNumber = this->m_columnNumber + 1;
      cVar2 = pcVar3[sVar7];
      if ((cVar2 == '\0') || ((Lexer *)this->m_end < ptr)) goto LAB_0012505e;
      if (cVar1 != '\'') break;
      pLVar8 = ptr;
      if (cVar2 == '\'') goto LAB_0012505e;
    }
    bVar5 = IsName(pLVar8,(char *)ptr);
    pLVar8 = ptr;
  } while (bVar5);
LAB_0012505e:
  if (cVar1 == '\'') {
    sVar7 = GetUtf8CharSize((char *)ptr);
    this->m_current = this->m_current + sVar7;
    this->m_columnNumber = this->m_columnNumber + 1;
    name._M_str = (char *)ptr_00;
    name._M_len = (long)ptr - (long)ptr_00;
    CreateSymbol(this,name);
  }
  else {
    name_00._M_str = (char *)ptr_00;
    name_00._M_len = (long)ptr - (long)ptr_00;
    CreateSymbol(this,name_00);
    if (*this->m_current == '\'') {
      sVar7 = GetUtf8CharSize(this->m_current);
      pcVar4 = this->m_current;
      pcVar3 = pcVar4 + sVar7;
      this->m_current = pcVar3;
      this->m_columnNumber = this->m_columnNumber + 1;
      if (pcVar4[sVar7] == '\0') {
        return;
      }
      if (this->m_end < pcVar3) {
        return;
      }
    }
  }
  pcVar3 = this->m_current;
  iVar6 = tolower((int)*pcVar3);
  if (iVar6 == 0x73) {
    sVar7 = GetUtf8CharSize(pcVar3);
    this->m_current = this->m_current + sVar7;
    this->m_columnNumber = this->m_columnNumber + 1;
  }
  return;
}

Assistant:

inline_t void Lexer::ParseName()
	{
		bool quotedName = false;
		if (*m_current == '\'')
		{
			quotedName = true;
			AdvanceCurrent();
		}

		const char * startName = m_current;

		if (!IsNameStart(m_current))
			Error("Invalid character in name");
		AdvanceCurrent();

		// Advance until we reach the end of the text or hit a non-name character
		while (!IsEndOfText())
		{
			if (quotedName)
			{
				if (*m_current == '\'')
					break;
			}
			else
			{
				if (!IsName(m_current))
					break;
			}
			AdvanceCurrent();
		}
		size_t count = m_current - startName;
		if (quotedName)
			AdvanceCurrent();
		CreateSymbol(std::string_view(startName, count));

		// Check for apostrophe-s.  If the name is quoted, no additional quote is needed
		if (!quotedName)
		{
			if (*m_current == '\'')
			{
				AdvanceCurrent();
				if (IsEndOfText())
					return;
			}
		}
		if (std::tolower(*m_current) == 's')
			AdvanceCurrent();
	}